

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_16777232,_true,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::TriangleMiMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  undefined4 *puVar6;
  float *pfVar7;
  float *pfVar8;
  undefined4 *puVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  float *pfVar17;
  float *pfVar18;
  float *pfVar19;
  float *pfVar20;
  float *pfVar21;
  float *pfVar22;
  float *pfVar23;
  float *pfVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  RTCFilterFunctionN p_Var27;
  undefined8 uVar28;
  Scene *pSVar29;
  Geometry *pGVar30;
  long lVar31;
  long lVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined8 uVar41;
  undefined1 auVar42 [16];
  RTCIntersectArguments *pRVar43;
  int iVar44;
  undefined4 uVar45;
  AABBNodeMB4D *node1;
  ulong uVar46;
  RTCRayN *pRVar48;
  uint uVar49;
  ulong uVar51;
  ulong uVar52;
  RTCFilterFunctionN p_Var53;
  RTCIntersectArguments *pRVar54;
  ulong uVar55;
  long lVar56;
  ulong uVar57;
  ulong uVar58;
  ulong uVar59;
  ulong uVar60;
  ulong uVar61;
  ulong uVar62;
  ulong uVar63;
  uint uVar64;
  uint uVar65;
  uint uVar66;
  float fVar67;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar85;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  float fVar94;
  float fVar102;
  float fVar103;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar97;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  float fVar108;
  float fVar113;
  float fVar114;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar112;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar122;
  float fVar124;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  float fVar123;
  float fVar125;
  undefined1 auVar121 [16];
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar133;
  float fVar135;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  float fVar134;
  float fVar136;
  undefined1 auVar132 [16];
  float fVar137;
  float fVar140;
  float fVar141;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar158;
  float fVar159;
  float fVar160;
  undefined1 auVar157 [16];
  float fVar161;
  float fVar162;
  float fVar164;
  float fVar165;
  float fVar166;
  undefined1 auVar163 [16];
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  undefined1 auVar171 [16];
  float fVar178;
  float fVar179;
  float fVar182;
  float fVar183;
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar189;
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  undefined1 auVar188 [16];
  UVIdentity<4> mapUV;
  float local_12e8;
  float fStack_12e4;
  float fStack_12e0;
  float fStack_12dc;
  undefined1 local_12d8 [8];
  float fStack_12d0;
  float fStack_12cc;
  Scene *scene;
  float fStack_1280;
  float fStack_127c;
  vbool<4> valid;
  float fStack_1260;
  float fStack_125c;
  undefined8 local_1258;
  undefined1 local_1208 [16];
  undefined1 (*local_11f0) [16];
  long local_11e8;
  long local_11e0;
  RTCFilterFunctionNArguments args;
  undefined8 local_1188;
  undefined8 uStack_1180;
  vfloat<4> tNear;
  undefined1 local_1128 [16];
  undefined1 local_1118 [16];
  float local_1108 [4];
  undefined1 local_10f8 [16];
  undefined1 local_10e8 [16];
  undefined1 local_10d8 [16];
  float local_10c8;
  float fStack_10c4;
  float fStack_10c0;
  float fStack_10bc;
  float local_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  float local_10a8;
  float fStack_10a4;
  float fStack_10a0;
  float fStack_109c;
  float local_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  float local_1088;
  float fStack_1084;
  float fStack_1080;
  float fStack_107c;
  float local_1078;
  float fStack_1074;
  float fStack_1070;
  float fStack_106c;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  undefined1 local_1038 [16];
  undefined1 local_1028 [16];
  undefined8 local_1018;
  undefined8 uStack_1010;
  RTCHitN local_1008 [16];
  undefined1 local_ff8 [16];
  undefined1 local_fe8 [16];
  undefined4 local_fd8;
  undefined4 uStack_fd4;
  undefined4 uStack_fd0;
  undefined4 uStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  undefined1 local_fb8 [16];
  uint local_fa8;
  uint uStack_fa4;
  uint uStack_fa0;
  uint uStack_f9c;
  undefined4 local_f98;
  undefined4 uStack_f94;
  undefined4 uStack_f90;
  undefined4 uStack_f8c;
  RTCFeatureFlags local_f88;
  RTCFeatureFlags RStack_f84;
  RTCFeatureFlags RStack_f80;
  RTCFeatureFlags RStack_f7c;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  ulong uVar47;
  RTCIntersectArguments *pRVar50;
  
  pRVar54 = (RTCIntersectArguments *)(stack + 1);
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  fVar67 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar94 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar127 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar161 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar167 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar168 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar184 = fVar161 * 0.99999964;
  fVar126 = fVar167 * 0.99999964;
  fVar178 = fVar168 * 0.99999964;
  fVar161 = fVar161 * 1.0000004;
  fVar167 = fVar167 * 1.0000004;
  fVar168 = fVar168 * 1.0000004;
  uVar57 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar63 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar62 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar44 = (tray->tnear).field_0.i[k];
  auVar138._4_4_ = iVar44;
  auVar138._0_4_ = iVar44;
  auVar138._8_4_ = iVar44;
  auVar138._12_4_ = iVar44;
  iVar44 = (tray->tfar).field_0.i[k];
  auVar87._4_4_ = iVar44;
  auVar87._0_4_ = iVar44;
  auVar87._8_4_ = iVar44;
  auVar87._12_4_ = iVar44;
  local_11f0 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_1058 = fVar67;
  fStack_1054 = fVar67;
  fStack_1050 = fVar67;
  fStack_104c = fVar67;
  local_1068 = fVar94;
  fStack_1064 = fVar94;
  fStack_1060 = fVar94;
  fStack_105c = fVar94;
  local_1078 = fVar127;
  fStack_1074 = fVar127;
  fStack_1070 = fVar127;
  fStack_106c = fVar127;
  local_1088 = fVar161;
  fStack_1084 = fVar161;
  fStack_1080 = fVar161;
  fStack_107c = fVar161;
  local_1098 = fVar167;
  fStack_1094 = fVar167;
  fStack_1090 = fVar167;
  fStack_108c = fVar167;
  local_10a8 = fVar168;
  fStack_10a4 = fVar168;
  fStack_10a0 = fVar168;
  fStack_109c = fVar168;
  local_10b8 = fVar178;
  fStack_10b4 = fVar178;
  fStack_10b0 = fVar178;
  fStack_10ac = fVar178;
  local_10c8 = fVar184;
  fStack_10c4 = fVar184;
  fStack_10c0 = fVar184;
  fStack_10bc = fVar184;
  pRVar50 = (RTCIntersectArguments *)k;
  fVar102 = fVar67;
  fVar103 = fVar67;
  fVar108 = fVar67;
  fVar113 = fVar94;
  fVar114 = fVar94;
  fVar115 = fVar94;
  fVar116 = fVar167;
  fVar117 = fVar167;
  fVar122 = fVar167;
  fVar123 = fVar127;
  fVar124 = fVar127;
  fVar125 = fVar127;
  fVar128 = fVar161;
  fVar129 = fVar161;
  fVar133 = fVar161;
  fVar134 = fVar168;
  fVar135 = fVar168;
  fVar136 = fVar168;
  fVar137 = fVar178;
  fVar140 = fVar178;
  fVar141 = fVar178;
  fVar142 = fVar184;
  fVar143 = fVar184;
  fVar144 = fVar184;
LAB_006fb1e5:
  do {
    do {
      if (pRVar54 == (RTCIntersectArguments *)stack) {
        return;
      }
      pRVar43 = pRVar54 + -1;
      pRVar54 = (RTCIntersectArguments *)&pRVar54[-1].filter;
    } while (*(float *)(ray + k * 4 + 0x80) <= *(float *)&pRVar43->intersect &&
             *(float *)&pRVar43->intersect != *(float *)(ray + k * 4 + 0x80));
    p_Var53 = *(RTCFilterFunctionN *)pRVar54;
    while (((ulong)p_Var53 & 8) == 0) {
      uVar46 = (ulong)p_Var53 & 0xfffffffffffffff0;
      fVar145 = *(float *)(ray + k * 4 + 0x70);
      pfVar24 = (float *)(uVar46 + 0x80 + uVar57);
      pfVar23 = (float *)(uVar46 + 0x20 + uVar57);
      auVar95._0_4_ = ((*pfVar24 * fVar145 + *pfVar23) - fVar67) * fVar184;
      auVar95._4_4_ = ((pfVar24[1] * fVar145 + pfVar23[1]) - fVar102) * fVar142;
      auVar95._8_4_ = ((pfVar24[2] * fVar145 + pfVar23[2]) - fVar103) * fVar143;
      auVar95._12_4_ = ((pfVar24[3] * fVar145 + pfVar23[3]) - fVar108) * fVar144;
      auVar95 = maxps(auVar138,auVar95);
      pfVar24 = (float *)(uVar46 + 0x80 + uVar63);
      pfVar23 = (float *)(uVar46 + 0x20 + uVar63);
      auVar104._0_4_ = ((*pfVar24 * fVar145 + *pfVar23) - fVar94) * fVar126;
      auVar104._4_4_ = ((pfVar24[1] * fVar145 + pfVar23[1]) - fVar113) * fVar126;
      auVar104._8_4_ = ((pfVar24[2] * fVar145 + pfVar23[2]) - fVar114) * fVar126;
      auVar104._12_4_ = ((pfVar24[3] * fVar145 + pfVar23[3]) - fVar115) * fVar126;
      pfVar24 = (float *)(uVar46 + 0x80 + uVar62);
      pfVar23 = (float *)(uVar46 + 0x20 + uVar62);
      auVar111._0_4_ = ((*pfVar24 * fVar145 + *pfVar23) - fVar127) * fVar178;
      auVar111._4_4_ = ((pfVar24[1] * fVar145 + pfVar23[1]) - fVar123) * fVar137;
      auVar111._8_4_ = ((pfVar24[2] * fVar145 + pfVar23[2]) - fVar124) * fVar140;
      auVar111._12_4_ = ((pfVar24[3] * fVar145 + pfVar23[3]) - fVar125) * fVar141;
      auVar104 = maxps(auVar104,auVar111);
      tNear.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar95,auVar104);
      pfVar24 = (float *)(uVar46 + 0x80 + (uVar57 ^ 0x10));
      pfVar23 = (float *)(uVar46 + 0x20 + (uVar57 ^ 0x10));
      auVar120._0_4_ = ((*pfVar24 * fVar145 + *pfVar23) - fVar67) * fVar161;
      auVar120._4_4_ = ((pfVar24[1] * fVar145 + pfVar23[1]) - fVar102) * fVar128;
      auVar120._8_4_ = ((pfVar24[2] * fVar145 + pfVar23[2]) - fVar103) * fVar129;
      auVar120._12_4_ = ((pfVar24[3] * fVar145 + pfVar23[3]) - fVar108) * fVar133;
      auVar95 = minps(auVar87,auVar120);
      pfVar24 = (float *)(uVar46 + 0x80 + (uVar63 ^ 0x10));
      pfVar23 = (float *)(uVar46 + 0x20 + (uVar63 ^ 0x10));
      auVar131._0_4_ = ((*pfVar24 * fVar145 + *pfVar23) - fVar94) * fVar167;
      auVar131._4_4_ = ((pfVar24[1] * fVar145 + pfVar23[1]) - fVar113) * fVar116;
      auVar131._8_4_ = ((pfVar24[2] * fVar145 + pfVar23[2]) - fVar114) * fVar117;
      auVar131._12_4_ = ((pfVar24[3] * fVar145 + pfVar23[3]) - fVar115) * fVar122;
      pfVar24 = (float *)(uVar46 + 0x80 + (uVar62 ^ 0x10));
      pfVar23 = (float *)(uVar46 + 0x20 + (uVar62 ^ 0x10));
      auVar118._0_4_ = ((*pfVar24 * fVar145 + *pfVar23) - fVar127) * fVar168;
      auVar118._4_4_ = ((pfVar24[1] * fVar145 + pfVar23[1]) - fVar123) * fVar134;
      auVar118._8_4_ = ((pfVar24[2] * fVar145 + pfVar23[2]) - fVar124) * fVar135;
      auVar118._12_4_ = ((pfVar24[3] * fVar145 + pfVar23[3]) - fVar125) * fVar136;
      auVar104 = minps(auVar131,auVar118);
      auVar95 = minps(auVar95,auVar104);
      if (((uint)p_Var53 & 7) == 6) {
        bVar33 = (fVar145 < *(float *)(uVar46 + 0xf0) && *(float *)(uVar46 + 0xe0) <= fVar145) &&
                 tNear.field_0._0_4_ <= auVar95._0_4_;
        bVar34 = (fVar145 < *(float *)(uVar46 + 0xf4) && *(float *)(uVar46 + 0xe4) <= fVar145) &&
                 tNear.field_0._4_4_ <= auVar95._4_4_;
        bVar35 = (fVar145 < *(float *)(uVar46 + 0xf8) && *(float *)(uVar46 + 0xe8) <= fVar145) &&
                 tNear.field_0._8_4_ <= auVar95._8_4_;
        bVar36 = (fVar145 < *(float *)(uVar46 + 0xfc) && *(float *)(uVar46 + 0xec) <= fVar145) &&
                 tNear.field_0._12_4_ <= auVar95._12_4_;
      }
      else {
        bVar33 = tNear.field_0._0_4_ <= auVar95._0_4_;
        bVar34 = tNear.field_0._4_4_ <= auVar95._4_4_;
        bVar35 = tNear.field_0._8_4_ <= auVar95._8_4_;
        bVar36 = tNear.field_0._12_4_ <= auVar95._12_4_;
      }
      auVar68._0_4_ = (uint)bVar33 * -0x80000000;
      auVar68._4_4_ = (uint)bVar34 * -0x80000000;
      auVar68._8_4_ = (uint)bVar35 * -0x80000000;
      auVar68._12_4_ = (uint)bVar36 * -0x80000000;
      uVar49 = movmskps((int)pRVar50,auVar68);
      pRVar50 = (RTCIntersectArguments *)(ulong)uVar49;
      if (uVar49 == 0) goto LAB_006fb1e5;
      pRVar50 = (RTCIntersectArguments *)0x0;
      if ((byte)uVar49 != 0) {
        for (; ((byte)uVar49 >> (long)pRVar50 & 1) == 0;
            pRVar50 = (RTCIntersectArguments *)((long)&((NodeRefPtr<4> *)&pRVar50->flags)->ptr + 1))
        {
        }
      }
      p_Var53 = *(RTCFilterFunctionN *)(uVar46 + (long)pRVar50 * 8);
      uVar49 = (uVar49 & 0xff) - 1 & uVar49 & 0xff;
      if (uVar49 != 0) {
        uVar64 = tNear.field_0.i[(long)pRVar50];
        lVar56 = 0;
        if (uVar49 != 0) {
          for (; (uVar49 >> lVar56 & 1) == 0; lVar56 = lVar56 + 1) {
          }
        }
        p_Var27 = *(RTCFilterFunctionN *)(uVar46 + lVar56 * 8);
        uVar65 = tNear.field_0.i[lVar56];
        uVar49 = uVar49 - 1 & uVar49;
        pRVar50 = (RTCIntersectArguments *)(ulong)uVar49;
        if (uVar49 == 0) {
          pRVar50 = pRVar54;
          if (uVar64 < uVar65) {
            *(RTCFilterFunctionN *)pRVar54 = p_Var27;
            *(uint *)&pRVar54->context = uVar65;
            pRVar54 = (RTCIntersectArguments *)&pRVar54->filter;
          }
          else {
            *(RTCFilterFunctionN *)pRVar54 = p_Var53;
            *(uint *)&pRVar54->context = uVar64;
            p_Var53 = p_Var27;
            pRVar54 = (RTCIntersectArguments *)&pRVar54->filter;
          }
        }
        else {
          auVar96._8_4_ = uVar64;
          auVar96._0_8_ = p_Var53;
          auVar96._12_4_ = 0;
          auVar109._8_4_ = uVar65;
          auVar109._0_8_ = p_Var27;
          auVar109._12_4_ = 0;
          lVar56 = 0;
          if (pRVar50 != (RTCIntersectArguments *)0x0) {
            for (; (uVar49 >> lVar56 & 1) == 0; lVar56 = lVar56 + 1) {
            }
          }
          uVar28 = *(undefined8 *)(uVar46 + lVar56 * 8);
          iVar44 = tNear.field_0.i[lVar56];
          auVar105._8_4_ = iVar44;
          auVar105._0_8_ = uVar28;
          auVar105._12_4_ = 0;
          auVar69._8_4_ = -(uint)((int)uVar64 < (int)uVar65);
          uVar49 = uVar49 - 1 & uVar49;
          if (uVar49 == 0) {
            auVar69._4_4_ = auVar69._8_4_;
            auVar69._0_4_ = auVar69._8_4_;
            auVar69._12_4_ = auVar69._8_4_;
            auVar119._8_4_ = uVar65;
            auVar119._0_8_ = p_Var27;
            auVar119._12_4_ = 0;
            auVar104 = blendvps(auVar119,auVar96,auVar69);
            auVar95 = blendvps(auVar96,auVar109,auVar69);
            auVar70._8_4_ = -(uint)(auVar104._8_4_ < iVar44);
            auVar70._4_4_ = auVar70._8_4_;
            auVar70._0_4_ = auVar70._8_4_;
            auVar70._12_4_ = auVar70._8_4_;
            auVar110._8_4_ = iVar44;
            auVar110._0_8_ = uVar28;
            auVar110._12_4_ = 0;
            auVar111 = blendvps(auVar110,auVar104,auVar70);
            auVar120 = blendvps(auVar104,auVar105,auVar70);
            auVar71._8_4_ = -(uint)(auVar95._8_4_ < auVar120._8_4_);
            auVar71._4_4_ = auVar71._8_4_;
            auVar71._0_4_ = auVar71._8_4_;
            auVar71._12_4_ = auVar71._8_4_;
            auVar104 = blendvps(auVar120,auVar95,auVar71);
            SVar97 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar95,auVar120,auVar71);
            *(StackItemT<embree::NodeRefPtr<4>_> *)pRVar54 = SVar97;
            pRVar54->filter = (RTCFilterFunctionN)auVar104._0_8_;
            pRVar54->intersect = (RTCIntersectFunctionN)auVar104._8_8_;
            p_Var53 = auVar111._0_8_;
            pRVar54 = pRVar54 + 1;
          }
          else {
            pRVar50 = (RTCIntersectArguments *)0x0;
            if (uVar49 != 0) {
              for (; (uVar49 >> (long)pRVar50 & 1) == 0;
                  pRVar50 = (RTCIntersectArguments *)
                            ((long)&((NodeRefPtr<4> *)&pRVar50->flags)->ptr + 1)) {
              }
            }
            auVar72._4_4_ = auVar69._8_4_;
            auVar72._0_4_ = auVar69._8_4_;
            auVar72._8_4_ = auVar69._8_4_;
            auVar72._12_4_ = auVar69._8_4_;
            auVar120 = blendvps(auVar109,auVar96,auVar72);
            auVar95 = blendvps(auVar96,auVar109,auVar72);
            auVar130._8_4_ = tNear.field_0.i[(long)pRVar50];
            auVar130._0_8_ = *(undefined8 *)(uVar46 + (long)pRVar50 * 8);
            auVar130._12_4_ = 0;
            auVar73._8_4_ = -(uint)(iVar44 < tNear.field_0.i[(long)pRVar50]);
            auVar73._4_4_ = auVar73._8_4_;
            auVar73._0_4_ = auVar73._8_4_;
            auVar73._12_4_ = auVar73._8_4_;
            auVar111 = blendvps(auVar130,auVar105,auVar73);
            auVar104 = blendvps(auVar105,auVar130,auVar73);
            auVar74._8_4_ = -(uint)(auVar95._8_4_ < auVar104._8_4_);
            auVar74._4_4_ = auVar74._8_4_;
            auVar74._0_4_ = auVar74._8_4_;
            auVar74._12_4_ = auVar74._8_4_;
            auVar131 = blendvps(auVar104,auVar95,auVar74);
            SVar97 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar95,auVar104,auVar74);
            auVar75._8_4_ = -(uint)(auVar120._8_4_ < auVar111._8_4_);
            auVar75._4_4_ = auVar75._8_4_;
            auVar75._0_4_ = auVar75._8_4_;
            auVar75._12_4_ = auVar75._8_4_;
            auVar95 = blendvps(auVar111,auVar120,auVar75);
            auVar104 = blendvps(auVar120,auVar111,auVar75);
            auVar76._8_4_ = -(uint)(auVar104._8_4_ < auVar131._8_4_);
            auVar76._4_4_ = auVar76._8_4_;
            auVar76._0_4_ = auVar76._8_4_;
            auVar76._12_4_ = auVar76._8_4_;
            SVar112 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar131,auVar104,auVar76);
            auVar104 = blendvps(auVar104,auVar131,auVar76);
            *(StackItemT<embree::NodeRefPtr<4>_> *)pRVar54 = SVar97;
            pRVar54->filter = (RTCFilterFunctionN)auVar104._0_8_;
            pRVar54->intersect = (RTCIntersectFunctionN)auVar104._8_8_;
            *(StackItemT<embree::NodeRefPtr<4>_> *)(pRVar54 + 1) = SVar112;
            p_Var53 = auVar95._0_8_;
            pRVar54 = (RTCIntersectArguments *)&pRVar54[1].filter;
          }
        }
      }
    }
    local_11e8 = (ulong)((uint)p_Var53 & 0xf) - 8;
    uVar46 = (ulong)p_Var53 & 0xfffffffffffffff0;
    for (local_11e0 = 0; local_11e0 != local_11e8; local_11e0 = local_11e0 + 1) {
      lVar56 = local_11e0 * 0x50;
      pSVar29 = context->scene;
      pGVar30 = (pSVar29->geometries).items[*(uint *)(uVar46 + 0x30 + lVar56)].ptr;
      fVar67 = (pGVar30->time_range).lower;
      fVar94 = (pGVar30->time_range).upper - fVar67;
      fVar127 = ((*(float *)(ray + k * 4 + 0x70) - fVar67) / fVar94) * pGVar30->fnumTimeSegments;
      auVar98 = roundss(ZEXT416((uint)fVar94),ZEXT416((uint)fVar127),9);
      fVar67 = pGVar30->fnumTimeSegments + -1.0;
      if (fVar67 <= auVar98._0_4_) {
        auVar98._0_4_ = fVar67;
      }
      fVar67 = 0.0;
      if (0.0 <= auVar98._0_4_) {
        fVar67 = auVar98._0_4_;
      }
      uVar61 = (ulong)*(uint *)(uVar46 + 4 + lVar56);
      lVar31 = *(long *)(*(long *)&pGVar30[2].numPrimitives + (long)(int)fVar67 * 0x38);
      lVar32 = *(long *)(*(long *)&pGVar30[2].numPrimitives + 0x38 + (long)(int)fVar67 * 0x38);
      pfVar23 = (float *)(lVar31 + (ulong)*(uint *)(uVar46 + lVar56) * 4);
      uVar55 = (ulong)*(uint *)(uVar46 + 0x10 + lVar56);
      pfVar24 = (float *)(lVar31 + uVar55 * 4);
      uVar58 = (ulong)*(uint *)(uVar46 + 0x20 + lVar56);
      puVar1 = (undefined8 *)(lVar31 + uVar58 * 4);
      uVar28 = *puVar1;
      uVar41 = puVar1[1];
      pfVar2 = (float *)(lVar31 + uVar61 * 4);
      uVar47 = (ulong)*(uint *)(uVar46 + 0x14 + lVar56);
      pfVar3 = (float *)(lVar31 + uVar47 * 4);
      uVar49 = *(uint *)(uVar46 + 0x24 + lVar56);
      pfVar4 = (float *)(lVar31 + (ulong)uVar49 * 4);
      uVar59 = (ulong)*(uint *)(uVar46 + 8 + lVar56);
      pfVar5 = (float *)(lVar31 + uVar59 * 4);
      puVar6 = (undefined4 *)(lVar31 + (ulong)*(uint *)(uVar46 + 0x18 + lVar56) * 4);
      uVar51 = (ulong)*(uint *)(uVar46 + 0x28 + lVar56);
      pfVar7 = (float *)(lVar31 + uVar51 * 4);
      uVar60 = (ulong)*(uint *)(uVar46 + 0xc + lVar56);
      pfVar8 = (float *)(lVar31 + uVar60 * 4);
      uVar52 = (ulong)*(uint *)(uVar46 + 0x1c + lVar56);
      puVar9 = (undefined4 *)(lVar31 + uVar52 * 4);
      pRVar50 = (RTCIntersectArguments *)(ulong)*(uint *)(uVar46 + 0x2c + lVar56);
      pfVar10 = (float *)(lVar31 + (long)pRVar50 * 4);
      pfVar11 = (float *)(lVar32 + (ulong)*(uint *)(uVar46 + lVar56) * 4);
      pfVar12 = (float *)(lVar32 + uVar55 * 4);
      fVar127 = fVar127 - fVar67;
      pfVar13 = (float *)(lVar32 + uVar61 * 4);
      pfVar14 = (float *)(lVar32 + uVar59 * 4);
      local_1258 = CONCAT44(*puVar9,*puVar6);
      local_12e8 = (float)uVar28;
      fStack_12e4 = (float)((ulong)uVar28 >> 0x20);
      fStack_12e0 = (float)uVar41;
      pfVar15 = (float *)(lVar32 + uVar60 * 4);
      pfVar16 = (float *)(lVar32 + local_1258 * 4);
      pfVar17 = (float *)(lVar32 + uVar47 * 4);
      pfVar18 = (float *)(lVar32 + uVar52 * 4);
      pfVar19 = (float *)(lVar32 + uVar58 * 4);
      pfVar20 = (float *)(lVar32 + uVar51 * 4);
      pfVar21 = (float *)(lVar32 + (ulong)uVar49 * 4);
      pfVar22 = (float *)(lVar32 + (long)pRVar50 * 4);
      fVar167 = 1.0 - fVar127;
      fStack_12dc = (float)((ulong)uVar41 >> 0x20);
      puVar1 = (undefined8 *)(uVar46 + 0x30 + lVar56);
      local_1018 = *puVar1;
      uStack_1010 = puVar1[1];
      puVar1 = (undefined8 *)(uVar46 + 0x40 + lVar56);
      local_1188 = *puVar1;
      uStack_1180 = puVar1[1];
      fVar67 = *(float *)(ray + k * 4);
      fVar94 = *(float *)(ray + k * 4 + 0x10);
      fVar161 = *(float *)(ray + k * 4 + 0x20);
      fVar128 = (*pfVar23 * fVar167 + *pfVar11 * fVar127) - fVar67;
      fVar133 = (*pfVar2 * fVar167 + *pfVar13 * fVar127) - fVar67;
      fVar135 = (*pfVar5 * fVar167 + *pfVar14 * fVar127) - fVar67;
      fVar136 = (*pfVar8 * fVar167 + *pfVar15 * fVar127) - fVar67;
      fVar169 = (pfVar23[1] * fVar167 + pfVar11[1] * fVar127) - fVar94;
      fVar172 = (pfVar2[1] * fVar167 + pfVar13[1] * fVar127) - fVar94;
      fVar174 = (pfVar5[1] * fVar167 + pfVar14[1] * fVar127) - fVar94;
      fVar176 = (pfVar8[1] * fVar167 + pfVar15[1] * fVar127) - fVar94;
      fVar116 = (pfVar23[2] * fVar167 + pfVar11[2] * fVar127) - fVar161;
      fVar122 = (pfVar2[2] * fVar167 + pfVar13[2] * fVar127) - fVar161;
      fStack_1280 = (fStack_1280 * fVar167 + pfVar14[2] * fVar127) - fVar161;
      fStack_127c = (fStack_127c * fVar167 + pfVar15[2] * fVar127) - fVar161;
      fVar137 = (*pfVar24 * fVar167 + *pfVar12 * fVar127) - fVar67;
      fVar140 = (*pfVar3 * fVar167 + *pfVar17 * fVar127) - fVar67;
      fVar141 = (fStack_1260 * fVar167 + *pfVar16 * fVar127) - fVar67;
      fVar178 = (fStack_125c * fVar167 + *pfVar18 * fVar127) - fVar67;
      fVar185 = (pfVar24[1] * fVar167 + pfVar12[1] * fVar127) - fVar94;
      fVar189 = (pfVar3[1] * fVar167 + pfVar17[1] * fVar127) - fVar94;
      fVar192 = ((float)puVar6[1] * fVar167 + pfVar16[1] * fVar127) - fVar94;
      fVar195 = ((float)puVar9[1] * fVar167 + pfVar18[1] * fVar127) - fVar94;
      fVar142 = (pfVar7[2] * fVar167 + pfVar12[2] * fVar127) - fVar161;
      fVar145 = (pfVar10[2] * fVar167 + pfVar17[2] * fVar127) - fVar161;
      fVar149 = (fStack_12d0 * fVar167 + pfVar16[2] * fVar127) - fVar161;
      fVar153 = (fStack_12cc * fVar167 + pfVar18[2] * fVar127) - fVar161;
      fVar143 = (local_12e8 * fVar167 + *pfVar19 * fVar127) - fVar67;
      fVar146 = (*pfVar4 * fVar167 + *pfVar21 * fVar127) - fVar67;
      fVar150 = (*pfVar7 * fVar167 + *pfVar20 * fVar127) - fVar67;
      fVar67 = (*pfVar10 * fVar167 + *pfVar22 * fVar127) - fVar67;
      fVar168 = (fStack_12e4 * fVar167 + pfVar19[1] * fVar127) - fVar94;
      fVar102 = (pfVar4[1] * fVar167 + pfVar21[1] * fVar127) - fVar94;
      fVar103 = (pfVar7[1] * fVar167 + pfVar20[1] * fVar127) - fVar94;
      fVar94 = (pfVar10[1] * fVar167 + pfVar22[1] * fVar127) - fVar94;
      fVar179 = (fVar167 * fStack_12e0 + fVar127 * pfVar19[2]) - fVar161;
      fVar182 = (fVar167 * pfVar4[2] + fVar127 * pfVar21[2]) - fVar161;
      fVar183 = (fVar167 * fStack_12e0 + fVar127 * pfVar20[2]) - fVar161;
      fVar161 = (fVar167 * fStack_12dc + fVar127 * pfVar22[2]) - fVar161;
      fVar108 = fVar143 - fVar128;
      fVar113 = fVar146 - fVar133;
      fVar114 = fVar150 - fVar135;
      fVar115 = fVar67 - fVar136;
      fVar156 = fVar168 - fVar169;
      fVar158 = fVar102 - fVar172;
      fVar159 = fVar103 - fVar174;
      fVar160 = fVar94 - fVar176;
      fVar144 = fVar179 - fVar116;
      fVar147 = fVar182 - fVar122;
      fVar151 = fVar183 - fStack_1280;
      fVar154 = fVar161 - fStack_127c;
      fVar127 = *(float *)(ray + k * 4 + 0x50);
      local_12d8._4_4_ = *(undefined4 *)(ray + k * 4 + 0x60);
      fVar167 = *(float *)(ray + k * 4 + 0x40);
      fVar129 = (fVar156 * (fVar179 + fVar116) - (fVar168 + fVar169) * fVar144) * fVar167 +
                ((fVar143 + fVar128) * fVar144 - (fVar179 + fVar116) * fVar108) * fVar127 +
                (fVar108 * (fVar168 + fVar169) - (fVar143 + fVar128) * fVar156) *
                (float)local_12d8._4_4_;
      fVar134 = (fVar158 * (fVar182 + fVar122) - (fVar102 + fVar172) * fVar147) * fVar167 +
                ((fVar146 + fVar133) * fVar147 - (fVar182 + fVar122) * fVar113) * fVar127 +
                (fVar113 * (fVar102 + fVar172) - (fVar146 + fVar133) * fVar158) *
                (float)local_12d8._4_4_;
      local_1038._0_8_ = CONCAT44(fVar134,fVar129);
      local_1038._8_4_ =
           (fVar159 * (fVar183 + fStack_1280) - (fVar103 + fVar174) * fVar151) * fVar167 +
           ((fVar150 + fVar135) * fVar151 - (fVar183 + fStack_1280) * fVar114) * fVar127 +
           (fVar114 * (fVar103 + fVar174) - (fVar150 + fVar135) * fVar159) * (float)local_12d8._4_4_
      ;
      local_1038._12_4_ =
           (fVar160 * (fVar161 + fStack_127c) - (fVar94 + fVar176) * fVar154) * fVar167 +
           ((fVar67 + fVar136) * fVar154 - (fVar161 + fStack_127c) * fVar115) * fVar127 +
           (fVar115 * (fVar94 + fVar176) - (fVar67 + fVar136) * fVar160) * (float)local_12d8._4_4_;
      fVar162 = fVar128 - fVar137;
      fVar164 = fVar133 - fVar140;
      fVar165 = fVar135 - fVar141;
      fVar166 = fVar136 - fVar178;
      fVar170 = fVar169 - fVar185;
      fVar173 = fVar172 - fVar189;
      fVar175 = fVar174 - fVar192;
      fVar177 = fVar176 - fVar195;
      fVar186 = fVar116 - fVar142;
      fVar190 = fVar122 - fVar145;
      fVar193 = fStack_1280 - fVar149;
      fVar196 = fStack_127c - fVar153;
      local_1028._0_4_ =
           (fVar170 * (fVar116 + fVar142) - (fVar169 + fVar185) * fVar186) * fVar167 +
           ((fVar128 + fVar137) * fVar186 - (fVar116 + fVar142) * fVar162) * fVar127 +
           (fVar162 * (fVar169 + fVar185) - (fVar128 + fVar137) * fVar170) * (float)local_12d8._4_4_
      ;
      local_1028._4_4_ =
           (fVar173 * (fVar122 + fVar145) - (fVar172 + fVar189) * fVar190) * fVar167 +
           ((fVar133 + fVar140) * fVar190 - (fVar122 + fVar145) * fVar164) * fVar127 +
           (fVar164 * (fVar172 + fVar189) - (fVar133 + fVar140) * fVar173) * (float)local_12d8._4_4_
      ;
      local_1028._8_4_ =
           (fVar175 * (fStack_1280 + fVar149) - (fVar174 + fVar192) * fVar193) * fVar167 +
           ((fVar135 + fVar141) * fVar193 - (fStack_1280 + fVar149) * fVar165) * fVar127 +
           (fVar165 * (fVar174 + fVar192) - (fVar135 + fVar141) * fVar175) * (float)local_12d8._4_4_
      ;
      local_1028._12_4_ =
           (fVar177 * (fStack_127c + fVar153) - (fVar176 + fVar195) * fVar196) * fVar167 +
           ((fVar136 + fVar178) * fVar196 - (fStack_127c + fVar153) * fVar166) * fVar127 +
           (fVar166 * (fVar176 + fVar195) - (fVar136 + fVar178) * fVar177) * (float)local_12d8._4_4_
      ;
      fVar187 = fVar137 - fVar143;
      fVar191 = fVar140 - fVar146;
      fVar194 = fVar141 - fVar150;
      fVar197 = fVar178 - fVar67;
      fVar117 = fVar185 - fVar168;
      fVar123 = fVar189 - fVar102;
      fVar124 = fVar192 - fVar103;
      fVar125 = fVar195 - fVar94;
      fVar184 = fVar142 - fVar179;
      fVar148 = fVar145 - fVar182;
      fVar152 = fVar149 - fVar183;
      fVar155 = fVar153 - fVar161;
      local_12d8._0_4_ = local_12d8._4_4_;
      fStack_12d0 = (float)local_12d8._4_4_;
      fStack_12cc = (float)local_12d8._4_4_;
      auVar77._0_4_ =
           (fVar117 * (fVar179 + fVar142) - (fVar168 + fVar185) * fVar184) * fVar167 +
           ((fVar143 + fVar137) * fVar184 - (fVar179 + fVar142) * fVar187) * fVar127 +
           (fVar187 * (fVar168 + fVar185) - (fVar143 + fVar137) * fVar117) * (float)local_12d8._4_4_
      ;
      auVar77._4_4_ =
           (fVar123 * (fVar182 + fVar145) - (fVar102 + fVar189) * fVar148) * fVar167 +
           ((fVar146 + fVar140) * fVar148 - (fVar182 + fVar145) * fVar191) * fVar127 +
           (fVar191 * (fVar102 + fVar189) - (fVar146 + fVar140) * fVar123) * (float)local_12d8._4_4_
      ;
      auVar77._8_4_ =
           (fVar124 * (fVar183 + fVar149) - (fVar103 + fVar192) * fVar152) * fVar167 +
           ((fVar150 + fVar141) * fVar152 - (fVar183 + fVar149) * fVar194) * fVar127 +
           (fVar194 * (fVar103 + fVar192) - (fVar150 + fVar141) * fVar124) * (float)local_12d8._4_4_
      ;
      auVar77._12_4_ =
           (fVar125 * (fVar161 + fVar153) - (fVar94 + fVar195) * fVar155) * fVar167 +
           ((fVar67 + fVar178) * fVar155 - (fVar161 + fVar153) * fVar197) * fVar127 +
           (fVar197 * (fVar94 + fVar195) - (fVar67 + fVar178) * fVar125) * (float)local_12d8._4_4_;
      local_1048 = fVar129 + local_1028._0_4_ + auVar77._0_4_;
      fStack_1044 = fVar134 + local_1028._4_4_ + auVar77._4_4_;
      fStack_1040 = local_1038._8_4_ + local_1028._8_4_ + auVar77._8_4_;
      fStack_103c = local_1038._12_4_ + local_1028._12_4_ + auVar77._12_4_;
      auVar86._8_4_ = local_1038._8_4_;
      auVar86._0_8_ = local_1038._0_8_;
      auVar86._12_4_ = local_1038._12_4_;
      auVar87 = minps(auVar86,local_1028);
      auVar87 = minps(auVar87,auVar77);
      auVar180._8_4_ = local_1038._8_4_;
      auVar180._0_8_ = local_1038._0_8_;
      auVar180._12_4_ = local_1038._12_4_;
      auVar95 = maxps(auVar180,local_1028);
      auVar95 = maxps(auVar95,auVar77);
      fVar67 = ABS(local_1048) * 1.1920929e-07;
      fVar94 = ABS(fStack_1044) * 1.1920929e-07;
      fVar161 = ABS(fStack_1040) * 1.1920929e-07;
      fVar168 = ABS(fStack_103c) * 1.1920929e-07;
      auVar181._4_4_ = -(uint)(auVar95._4_4_ <= fVar94);
      auVar181._0_4_ = -(uint)(auVar95._0_4_ <= fVar67);
      auVar181._8_4_ = -(uint)(auVar95._8_4_ <= fVar161);
      auVar181._12_4_ = -(uint)(auVar95._12_4_ <= fVar168);
      auVar88._4_4_ = -(uint)(-fVar94 <= auVar87._4_4_);
      auVar88._0_4_ = -(uint)(-fVar67 <= auVar87._0_4_);
      auVar88._8_4_ = -(uint)(-fVar161 <= auVar87._8_4_);
      auVar88._12_4_ = -(uint)(-fVar168 <= auVar87._12_4_);
      auVar181 = auVar181 | auVar88;
      iVar44 = movmskps(uVar49,auVar181);
      if (iVar44 != 0) {
        auVar139._0_4_ = fVar156 * fVar186 - fVar170 * fVar144;
        auVar139._4_4_ = fVar158 * fVar190 - fVar173 * fVar147;
        auVar139._8_4_ = fVar159 * fVar193 - fVar175 * fVar151;
        auVar139._12_4_ = fVar160 * fVar196 - fVar177 * fVar154;
        auVar157._0_4_ = fVar170 * fVar184 - fVar117 * fVar186;
        auVar157._4_4_ = fVar173 * fVar148 - fVar123 * fVar190;
        auVar157._8_4_ = fVar175 * fVar152 - fVar124 * fVar193;
        auVar157._12_4_ = fVar177 * fVar155 - fVar125 * fVar196;
        auVar78._4_4_ = -(uint)(ABS(fVar173 * fVar147) < ABS(fVar123 * fVar190));
        auVar78._0_4_ = -(uint)(ABS(fVar170 * fVar144) < ABS(fVar117 * fVar186));
        auVar78._8_4_ = -(uint)(ABS(fVar175 * fVar151) < ABS(fVar124 * fVar193));
        auVar78._12_4_ = -(uint)(ABS(fVar177 * fVar154) < ABS(fVar125 * fVar196));
        local_10f8 = blendvps(auVar157,auVar139,auVar78);
        auVar188._0_4_ = fVar187 * fVar186 - fVar162 * fVar184;
        auVar188._4_4_ = fVar191 * fVar190 - fVar164 * fVar148;
        auVar188._8_4_ = fVar194 * fVar193 - fVar165 * fVar152;
        auVar188._12_4_ = fVar197 * fVar196 - fVar166 * fVar155;
        auVar79._4_4_ = -(uint)(ABS(fVar113 * fVar190) < ABS(fVar164 * fVar148));
        auVar79._0_4_ = -(uint)(ABS(fVar108 * fVar186) < ABS(fVar162 * fVar184));
        auVar79._8_4_ = -(uint)(ABS(fVar114 * fVar193) < ABS(fVar165 * fVar152));
        auVar79._12_4_ = -(uint)(ABS(fVar115 * fVar196) < ABS(fVar166 * fVar155));
        auVar37._4_4_ = fVar147 * fVar164 - fVar113 * fVar190;
        auVar37._0_4_ = fVar144 * fVar162 - fVar108 * fVar186;
        auVar37._8_4_ = fVar151 * fVar165 - fVar114 * fVar193;
        auVar37._12_4_ = fVar154 * fVar166 - fVar115 * fVar196;
        local_10e8 = blendvps(auVar188,auVar37,auVar79);
        auVar121._0_4_ = fVar108 * fVar170 - fVar162 * fVar156;
        auVar121._4_4_ = fVar113 * fVar173 - fVar164 * fVar158;
        auVar121._8_4_ = fVar114 * fVar175 - fVar165 * fVar159;
        auVar121._12_4_ = fVar115 * fVar177 - fVar166 * fVar160;
        auVar163._0_4_ = fVar162 * fVar117 - fVar187 * fVar170;
        auVar163._4_4_ = fVar164 * fVar123 - fVar191 * fVar173;
        auVar163._8_4_ = fVar165 * fVar124 - fVar194 * fVar175;
        auVar163._12_4_ = fVar166 * fVar125 - fVar197 * fVar177;
        auVar80._4_4_ = -(uint)(ABS(fVar164 * fVar158) < ABS(fVar191 * fVar173));
        auVar80._0_4_ = -(uint)(ABS(fVar162 * fVar156) < ABS(fVar187 * fVar170));
        auVar80._8_4_ = -(uint)(ABS(fVar165 * fVar159) < ABS(fVar194 * fVar175));
        auVar80._12_4_ = -(uint)(ABS(fVar166 * fVar160) < ABS(fVar197 * fVar177));
        local_10d8 = blendvps(auVar163,auVar121,auVar80);
        fVar108 = fVar167 * local_10f8._0_4_ +
                  fVar127 * local_10e8._0_4_ + (float)local_12d8._4_4_ * local_10d8._0_4_;
        fVar113 = fVar167 * local_10f8._4_4_ +
                  fVar127 * local_10e8._4_4_ + (float)local_12d8._4_4_ * local_10d8._4_4_;
        fVar114 = fVar167 * local_10f8._8_4_ +
                  fVar127 * local_10e8._8_4_ + (float)local_12d8._4_4_ * local_10d8._8_4_;
        fVar115 = fVar167 * local_10f8._12_4_ +
                  fVar127 * local_10e8._12_4_ + (float)local_12d8._4_4_ * local_10d8._12_4_;
        fVar108 = fVar108 + fVar108;
        fVar113 = fVar113 + fVar113;
        fVar114 = fVar114 + fVar114;
        fVar115 = fVar115 + fVar115;
        auVar81._0_4_ = fVar116 * local_10d8._0_4_;
        auVar81._4_4_ = fVar122 * local_10d8._4_4_;
        auVar81._8_4_ = fStack_1280 * local_10d8._8_4_;
        auVar81._12_4_ = fStack_127c * local_10d8._12_4_;
        fVar167 = fVar128 * local_10f8._0_4_ + fVar169 * local_10e8._0_4_ + auVar81._0_4_;
        fVar168 = fVar133 * local_10f8._4_4_ + fVar172 * local_10e8._4_4_ + auVar81._4_4_;
        fVar102 = fVar135 * local_10f8._8_4_ + fVar174 * local_10e8._8_4_ + auVar81._8_4_;
        fVar103 = fVar136 * local_10f8._12_4_ + fVar176 * local_10e8._12_4_ + auVar81._12_4_;
        auVar40._4_4_ = fVar113;
        auVar40._0_4_ = fVar108;
        auVar40._8_4_ = fVar114;
        auVar40._12_4_ = fVar115;
        auVar87 = rcpps(auVar81,auVar40);
        fVar67 = auVar87._0_4_;
        fVar94 = auVar87._4_4_;
        fVar127 = auVar87._8_4_;
        fVar161 = auVar87._12_4_;
        fVar167 = ((1.0 - fVar108 * fVar67) * fVar67 + fVar67) * (fVar167 + fVar167);
        fVar168 = ((1.0 - fVar113 * fVar94) * fVar94 + fVar94) * (fVar168 + fVar168);
        fVar127 = ((1.0 - fVar114 * fVar127) * fVar127 + fVar127) * (fVar102 + fVar102);
        fVar161 = ((1.0 - fVar115 * fVar161) * fVar161 + fVar161) * (fVar103 + fVar103);
        fVar67 = *(float *)(ray + k * 4 + 0x80);
        fVar94 = *(float *)(ray + k * 4 + 0x30);
        auVar89._4_4_ = -(uint)(fVar94 <= fVar168);
        auVar89._0_4_ = -(uint)(fVar94 <= fVar167);
        auVar89._8_4_ = -(uint)(fVar94 <= fVar127);
        auVar89._12_4_ = -(uint)(fVar94 <= fVar161);
        auVar82._0_4_ = -(uint)(fVar167 <= fVar67 && fVar94 <= fVar167) & auVar181._0_4_;
        auVar82._4_4_ = -(uint)(fVar168 <= fVar67 && fVar94 <= fVar168) & auVar181._4_4_;
        auVar82._8_4_ = -(uint)(fVar127 <= fVar67 && fVar94 <= fVar127) & auVar181._8_4_;
        auVar82._12_4_ = -(uint)(fVar161 <= fVar67 && fVar94 <= fVar161) & auVar181._12_4_;
        iVar44 = movmskps(iVar44,auVar82);
        fStack_1260 = fVar152;
        fStack_125c = fVar155;
        if (iVar44 != 0) {
          valid.field_0.i[0] = auVar82._0_4_ & -(uint)(fVar108 != 0.0);
          valid.field_0.i[1] = auVar82._4_4_ & -(uint)(fVar113 != 0.0);
          valid.field_0.i[2] = auVar82._8_4_ & -(uint)(fVar114 != 0.0);
          valid.field_0.i[3] = auVar82._12_4_ & -(uint)(fVar115 != 0.0);
          iVar44 = movmskps(iVar44,(undefined1  [16])valid.field_0);
          if (iVar44 != 0) {
            tNear.field_0.v[2] = local_1038._8_4_;
            tNear.field_0._0_8_ = local_1038._0_8_;
            tNear.field_0.v[3] = local_1038._12_4_;
            auVar42._4_4_ = fStack_1044;
            auVar42._0_4_ = local_1048;
            auVar42._8_4_ = fStack_1040;
            auVar42._12_4_ = fStack_103c;
            local_1108[0] = fVar167;
            local_1108[1] = fVar168;
            local_1108[2] = fVar127;
            local_1108[3] = fVar161;
            auVar87 = rcpps(auVar89,auVar42);
            fVar94 = auVar87._0_4_;
            fVar102 = auVar87._4_4_;
            fVar103 = auVar87._8_4_;
            fVar108 = auVar87._12_4_;
            fVar94 = (float)(-(uint)(1e-18 <= ABS(local_1048)) &
                            (uint)(((float)DAT_01f46a60 - local_1048 * fVar94) * fVar94 + fVar94));
            fVar102 = (float)(-(uint)(1e-18 <= ABS(fStack_1044)) &
                             (uint)((DAT_01f46a60._4_4_ - fStack_1044 * fVar102) * fVar102 + fVar102
                                   ));
            fVar103 = (float)(-(uint)(1e-18 <= ABS(fStack_1040)) &
                             (uint)((DAT_01f46a60._8_4_ - fStack_1040 * fVar103) * fVar103 + fVar103
                                   ));
            fVar108 = (float)(-(uint)(1e-18 <= ABS(fStack_103c)) &
                             (uint)((DAT_01f46a60._12_4_ - fStack_103c * fVar108) * fVar108 +
                                   fVar108));
            auVar132._0_4_ = fVar129 * fVar94;
            auVar132._4_4_ = fVar134 * fVar102;
            auVar132._8_4_ = local_1038._8_4_ * fVar103;
            auVar132._12_4_ = local_1038._12_4_ * fVar108;
            local_1128 = minps(auVar132,_DAT_01f46a60);
            auVar171._0_4_ = fVar94 * local_1028._0_4_;
            auVar171._4_4_ = fVar102 * local_1028._4_4_;
            auVar171._8_4_ = fVar103 * local_1028._8_4_;
            auVar171._12_4_ = fVar108 * local_1028._12_4_;
            local_1118 = minps(auVar171,_DAT_01f46a60);
            auVar38._4_4_ = fVar168;
            auVar38._0_4_ = fVar167;
            auVar38._8_4_ = fVar127;
            auVar38._12_4_ = fVar161;
            auVar95 = blendvps(_DAT_01f45a30,auVar38,(undefined1  [16])valid.field_0);
            auVar106._4_4_ = auVar95._0_4_;
            auVar106._0_4_ = auVar95._4_4_;
            auVar106._8_4_ = auVar95._12_4_;
            auVar106._12_4_ = auVar95._8_4_;
            auVar87 = minps(auVar106,auVar95);
            auVar90._0_8_ = auVar87._8_8_;
            auVar90._8_4_ = auVar87._0_4_;
            auVar90._12_4_ = auVar87._4_4_;
            auVar87 = minps(auVar90,auVar87);
            uVar49 = -(uint)(auVar87._0_4_ == auVar95._0_4_);
            uVar64 = -(uint)(auVar87._4_4_ == auVar95._4_4_);
            uVar65 = -(uint)(auVar87._8_4_ == auVar95._8_4_);
            uVar66 = -(uint)(auVar87._12_4_ == auVar95._12_4_);
            auVar101._4_4_ = uVar64;
            auVar101._0_4_ = uVar49;
            auVar99._0_4_ = uVar49 & valid.field_0.i[0];
            auVar99._4_4_ = uVar64 & valid.field_0.i[1];
            auVar99._8_4_ = uVar65 & valid.field_0.i[2];
            auVar99._12_4_ = uVar66 & valid.field_0.i[3];
            iVar44 = movmskps((int)&mapUV,auVar99);
            auVar100._8_4_ = 0xffffffff;
            auVar100._0_8_ = 0xffffffffffffffff;
            auVar100._12_4_ = 0xffffffff;
            if (iVar44 != 0) {
              auVar101._8_4_ = uVar65;
              auVar101._12_4_ = uVar66;
              auVar100 = auVar101;
            }
            auVar83._0_4_ = valid.field_0.i[0] & auVar100._0_4_;
            auVar83._4_4_ = valid.field_0.i[1] & auVar100._4_4_;
            auVar83._8_4_ = valid.field_0.i[2] & auVar100._8_4_;
            auVar83._12_4_ = valid.field_0.i[3] & auVar100._12_4_;
            uVar45 = movmskps(iVar44,auVar83);
            uVar47 = CONCAT44((int)((ulong)&mapUV >> 0x20),uVar45);
            lVar56 = 0;
            auVar87 = ZEXT416((uint)fVar67);
            if (uVar47 != 0) {
              for (; (uVar47 >> lVar56 & 1) == 0; lVar56 = lVar56 + 1) {
              }
            }
LAB_006fbdf5:
            local_fa8 = *(uint *)((long)&local_1018 + lVar56 * 4);
            pRVar48 = (RTCRayN *)(ulong)local_fa8;
            pGVar30 = (pSVar29->geometries).items[(long)pRVar48].ptr;
            pRVar50 = (RTCIntersectArguments *)(ulong)*(uint *)(ray + k * 4 + 0x90);
            auVar95 = auVar87;
            if ((pGVar30->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
              valid.field_0.v[lVar56] = 0.0;
            }
            else {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar30->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                uVar45 = *(undefined4 *)(local_1128 + lVar56 * 4);
                fVar67 = local_1108[lVar56 + -4];
                *(float *)(ray + k * 4 + 0x80) = local_1108[lVar56];
                *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_10f8 + lVar56 * 4);
                *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_10e8 + lVar56 * 4);
                *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_10d8 + lVar56 * 4);
                *(undefined4 *)(ray + k * 4 + 0xf0) = uVar45;
                *(float *)(ray + k * 4 + 0x100) = fVar67;
                uVar49 = *(uint *)((long)&local_1188 + lVar56 * 4);
                pRVar50 = (RTCIntersectArguments *)(ulong)uVar49;
                *(uint *)(ray + k * 4 + 0x110) = uVar49;
                *(uint *)(ray + k * 4 + 0x120) = local_fa8;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                goto LAB_006fc292;
              }
              local_fd8 = *(undefined4 *)(local_1128 + lVar56 * 4);
              local_fc8 = local_1108[lVar56 + -4];
              uVar45 = *(undefined4 *)(local_10f8 + lVar56 * 4);
              uVar25 = *(undefined4 *)(local_10e8 + lVar56 * 4);
              pRVar50 = (RTCIntersectArguments *)context->user;
              uVar26 = *(undefined4 *)((long)&local_1188 + lVar56 * 4);
              local_fb8._4_4_ = uVar26;
              local_fb8._0_4_ = uVar26;
              local_fb8._8_4_ = uVar26;
              local_fb8._12_4_ = uVar26;
              local_ff8._4_4_ = uVar25;
              local_ff8._0_4_ = uVar25;
              local_ff8._8_4_ = uVar25;
              local_ff8._12_4_ = uVar25;
              uVar25 = *(undefined4 *)(local_10d8 + lVar56 * 4);
              local_fe8._4_4_ = uVar25;
              local_fe8._0_4_ = uVar25;
              local_fe8._8_4_ = uVar25;
              local_fe8._12_4_ = uVar25;
              local_1008[0] = (RTCHitN)(char)uVar45;
              local_1008[1] = (RTCHitN)(char)((uint)uVar45 >> 8);
              local_1008[2] = (RTCHitN)(char)((uint)uVar45 >> 0x10);
              local_1008[3] = (RTCHitN)(char)((uint)uVar45 >> 0x18);
              local_1008[4] = (RTCHitN)(char)uVar45;
              local_1008[5] = (RTCHitN)(char)((uint)uVar45 >> 8);
              local_1008[6] = (RTCHitN)(char)((uint)uVar45 >> 0x10);
              local_1008[7] = (RTCHitN)(char)((uint)uVar45 >> 0x18);
              local_1008[8] = (RTCHitN)(char)uVar45;
              local_1008[9] = (RTCHitN)(char)((uint)uVar45 >> 8);
              local_1008[10] = (RTCHitN)(char)((uint)uVar45 >> 0x10);
              local_1008[0xb] = (RTCHitN)(char)((uint)uVar45 >> 0x18);
              local_1008[0xc] = (RTCHitN)(char)uVar45;
              local_1008[0xd] = (RTCHitN)(char)((uint)uVar45 >> 8);
              local_1008[0xe] = (RTCHitN)(char)((uint)uVar45 >> 0x10);
              local_1008[0xf] = (RTCHitN)(char)((uint)uVar45 >> 0x18);
              uStack_fd4 = local_fd8;
              uStack_fd0 = local_fd8;
              uStack_fcc = local_fd8;
              fStack_fc4 = local_fc8;
              fStack_fc0 = local_fc8;
              fStack_fbc = local_fc8;
              uStack_fa4 = local_fa8;
              uStack_fa0 = local_fa8;
              uStack_f9c = local_fa8;
              local_f98 = (undefined4)((NodeRefPtr<4> *)&pRVar50->flags)->ptr;
              uStack_f94 = local_f98;
              uStack_f90 = local_f98;
              uStack_f8c = local_f98;
              local_f88 = pRVar50->feature_mask;
              RStack_f84 = local_f88;
              RStack_f80 = local_f88;
              RStack_f7c = local_f88;
              *(float *)(ray + k * 4 + 0x80) = local_1108[lVar56];
              local_1208 = *local_11f0;
              args.valid = (int *)local_1208;
              args.geometryUserPtr = pGVar30->userPtr;
              args.context = context->user;
              args.hit = local_1008;
              args.N = 4;
              pRVar48 = (RTCRayN *)pGVar30->intersectionFilterN;
              args.ray = (RTCRayN *)ray;
              if (pRVar48 != (RTCRayN *)0x0) {
                pRVar48 = (RTCRayN *)(*(code *)pRVar48)(&args);
              }
              if (local_1208 == (undefined1  [16])0x0) {
                auVar91._8_4_ = 0xffffffff;
                auVar91._0_8_ = 0xffffffffffffffff;
                auVar91._12_4_ = 0xffffffff;
                auVar91 = auVar91 ^ _DAT_01f46b70;
              }
              else {
                pRVar50 = context->args;
                pRVar48 = (RTCRayN *)pRVar50->filter;
                if ((pRVar48 != (RTCRayN *)0x0) &&
                   (((((NodeRefPtr<4> *)&pRVar50->flags)->ptr & 2) != 0 ||
                    (((pGVar30->field_8).field_0x2 & 0x40) != 0)))) {
                  pRVar48 = (RTCRayN *)(*(code *)pRVar48)(&args);
                }
                auVar84._0_4_ = -(uint)(local_1208._0_4_ == 0);
                auVar84._4_4_ = -(uint)(local_1208._4_4_ == 0);
                auVar84._8_4_ = -(uint)(local_1208._8_4_ == 0);
                auVar84._12_4_ = -(uint)(local_1208._12_4_ == 0);
                auVar91 = auVar84 ^ _DAT_01f46b70;
                if (local_1208 != (undefined1  [16])0x0) {
                  auVar104 = blendvps(*(undefined1 (*) [16])args.hit,
                                      *(undefined1 (*) [16])(args.ray + 0xc0),auVar84);
                  *(undefined1 (*) [16])(args.ray + 0xc0) = auVar104;
                  auVar104 = blendvps(*(undefined1 (*) [16])(args.hit + 0x10),
                                      *(undefined1 (*) [16])(args.ray + 0xd0),auVar84);
                  *(undefined1 (*) [16])(args.ray + 0xd0) = auVar104;
                  auVar104 = blendvps(*(undefined1 (*) [16])(args.hit + 0x20),
                                      *(undefined1 (*) [16])(args.ray + 0xe0),auVar84);
                  *(undefined1 (*) [16])(args.ray + 0xe0) = auVar104;
                  auVar104 = blendvps(*(undefined1 (*) [16])(args.hit + 0x30),
                                      *(undefined1 (*) [16])(args.ray + 0xf0),auVar84);
                  *(undefined1 (*) [16])(args.ray + 0xf0) = auVar104;
                  auVar104 = blendvps(*(undefined1 (*) [16])(args.hit + 0x40),
                                      *(undefined1 (*) [16])(args.ray + 0x100),auVar84);
                  *(undefined1 (*) [16])(args.ray + 0x100) = auVar104;
                  auVar104 = blendvps(*(undefined1 (*) [16])(args.hit + 0x50),
                                      *(undefined1 (*) [16])(args.ray + 0x110),auVar84);
                  *(undefined1 (*) [16])(args.ray + 0x110) = auVar104;
                  auVar104 = blendvps(*(undefined1 (*) [16])(args.hit + 0x60),
                                      *(undefined1 (*) [16])(args.ray + 0x120),auVar84);
                  *(undefined1 (*) [16])(args.ray + 0x120) = auVar104;
                  auVar104 = blendvps(*(undefined1 (*) [16])(args.hit + 0x70),
                                      *(undefined1 (*) [16])(args.ray + 0x130),auVar84);
                  *(undefined1 (*) [16])(args.ray + 0x130) = auVar104;
                  auVar104 = blendvps(*(undefined1 (*) [16])(args.hit + 0x80),
                                      *(undefined1 (*) [16])(args.ray + 0x140),auVar84);
                  *(undefined1 (*) [16])(args.ray + 0x140) = auVar104;
                  pRVar48 = args.ray;
                  pRVar50 = (RTCIntersectArguments *)args.hit;
                }
              }
              if ((_DAT_01f46b40 & auVar91) == (undefined1  [16])0x0) {
                *(int *)(ray + k * 4 + 0x80) = auVar87._0_4_;
              }
              else {
                auVar95 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
              }
              valid.field_0.v[lVar56] = 0.0;
              fVar67 = auVar95._0_4_;
              valid.field_0.i[0] = -(uint)(fVar167 <= fVar67) & valid.field_0.i[0];
              valid.field_0.i[1] = -(uint)(fVar168 <= fVar67) & valid.field_0.i[1];
              valid.field_0.i[2] = -(uint)(fVar127 <= fVar67) & valid.field_0.i[2];
              valid.field_0.i[3] = -(uint)(fVar161 <= fVar67) & valid.field_0.i[3];
              _local_12d8 = auVar87;
            }
            iVar44 = movmskps((int)pRVar48,(undefined1  [16])valid.field_0);
            if (iVar44 == 0) goto LAB_006fc292;
            auVar39._4_4_ = fVar168;
            auVar39._0_4_ = fVar167;
            auVar39._8_4_ = fVar127;
            auVar39._12_4_ = fVar161;
            auVar104 = blendvps(_DAT_01f45a30,auVar39,(undefined1  [16])valid.field_0);
            auVar107._4_4_ = auVar104._0_4_;
            auVar107._0_4_ = auVar104._4_4_;
            auVar107._8_4_ = auVar104._12_4_;
            auVar107._12_4_ = auVar104._8_4_;
            auVar87 = minps(auVar107,auVar104);
            auVar92._0_8_ = auVar87._8_8_;
            auVar92._8_4_ = auVar87._0_4_;
            auVar92._12_4_ = auVar87._4_4_;
            auVar87 = minps(auVar92,auVar87);
            auVar93._0_8_ =
                 CONCAT44(-(uint)(auVar87._4_4_ == auVar104._4_4_) & valid.field_0._4_4_,
                          -(uint)(auVar87._0_4_ == auVar104._0_4_) & valid.field_0._0_4_);
            auVar93._8_4_ = -(uint)(auVar87._8_4_ == auVar104._8_4_) & valid.field_0._8_4_;
            auVar93._12_4_ = -(uint)(auVar87._12_4_ == auVar104._12_4_) & valid.field_0._12_4_;
            iVar44 = movmskps(iVar44,auVar93);
            aVar85 = valid.field_0;
            if (iVar44 != 0) {
              aVar85.i[2] = auVar93._8_4_;
              aVar85._0_8_ = auVar93._0_8_;
              aVar85.i[3] = auVar93._12_4_;
            }
            uVar45 = movmskps(iVar44,(undefined1  [16])aVar85);
            uVar47 = CONCAT44((int)((ulong)pRVar48 >> 0x20),uVar45);
            lVar56 = 0;
            auVar87 = auVar95;
            if (uVar47 != 0) {
              for (; (uVar47 >> lVar56 & 1) == 0; lVar56 = lVar56 + 1) {
              }
            }
            goto LAB_006fbdf5;
          }
        }
      }
LAB_006fc292:
      fVar67 = local_1058;
      fVar102 = fStack_1054;
      fVar103 = fStack_1050;
      fVar108 = fStack_104c;
      fVar94 = local_1068;
      fVar113 = fStack_1064;
      fVar114 = fStack_1060;
      fVar115 = fStack_105c;
      fVar167 = local_1098;
      fVar116 = fStack_1094;
      fVar117 = fStack_1090;
      fVar122 = fStack_108c;
      fVar127 = local_1078;
      fVar123 = fStack_1074;
      fVar124 = fStack_1070;
      fVar125 = fStack_106c;
      fVar161 = local_1088;
      fVar128 = fStack_1084;
      fVar129 = fStack_1080;
      fVar133 = fStack_107c;
      fVar168 = local_10a8;
      fVar134 = fStack_10a4;
      fVar135 = fStack_10a0;
      fVar136 = fStack_109c;
      fVar178 = local_10b8;
      fVar137 = fStack_10b4;
      fVar140 = fStack_10b0;
      fVar141 = fStack_10ac;
      fVar184 = local_10c8;
      fVar142 = fStack_10c4;
      fVar143 = fStack_10c0;
      fVar144 = fStack_10bc;
    }
    uVar45 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar87._4_4_ = uVar45;
    auVar87._0_4_ = uVar45;
    auVar87._8_4_ = uVar45;
    auVar87._12_4_ = uVar45;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }